

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O0

void __thiscall tcmalloc::StringGenericWriter::~StringGenericWriter(StringGenericWriter *this)

{
  string *psVar1;
  StringGenericWriter *this_local;
  
  (this->super_GenericWriter)._vptr_GenericWriter = (_func_int **)&PTR__StringGenericWriter_00197ca0
  ;
  GenericWriter::FinalRecycle(&this->super_GenericWriter);
  if (this->unused_size_ != 0) {
    psVar1 = this->s_;
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)psVar1);
  }
  GenericWriter::~GenericWriter(&this->super_GenericWriter);
  return;
}

Assistant:

StringGenericWriter::~StringGenericWriter() {
  FinalRecycle();
  if (unused_size_) {
    s_->resize(s_->size() - unused_size_);
  }
}